

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O3

bool __thiscall VertexAttrib64Bit::LimitTest::testDrawElements(LimitTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  GLenum GVar2;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  (*(this->super_Base).gl.beginTransformFeedback)(0);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"BeginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xa3c);
  (*(this->super_Base).gl.drawElements)(0,0x400,0x1405,(void *)0x0);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"DrawElements",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xa3f);
  (*(this->super_Base).gl.endTransformFeedback)();
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"EndTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xa42);
  bVar1 = verifyResult(this,false);
  if (!bVar1) {
    local_198._0_8_ = (this->super_Base).m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Draw function: DrawElements",0x1b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
  }
  return bVar1;
}

Assistant:

bool LimitTest::testDrawElements() const
{
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

	gl.drawElements(GL_POINTS, m_n_vertices, GL_UNSIGNED_INT, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

	if (true == verifyResult(false))
	{
		return true;
	}
	else
	{
		m_log << tcu::TestLog::Message << "Draw function: DrawElements" << tcu::TestLog::EndMessage;

		return false;
	}
}